

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_parse_long_option(nn_parse_context *ctx)

{
  int iVar1;
  char *pcVar2;
  nn_option *pnVar3;
  int local_44;
  int i;
  char *arg;
  int best_match;
  int cur_prefix;
  int longest_prefix;
  char *b;
  char *a;
  nn_option *opt;
  nn_parse_context *ctx_local;
  
  pcVar2 = ctx->data + 2;
  best_match = 0;
  arg._4_4_ = -1;
  local_44 = 0;
  do {
    pnVar3 = ctx->options + local_44;
    if (pnVar3->longname == (char *)0x0) {
LAB_00105cba:
      if (arg._4_4_ < 0) {
        if (best_match < 1) {
          nn_error_unknown_long_option(ctx);
        }
        else {
          nn_error_ambiguous_option(ctx);
        }
      }
      else {
        pnVar3 = ctx->options;
        ctx->last_option_usage[arg._4_4_] = ctx->data;
        if (pcVar2[best_match] == '=') {
          iVar1 = nn_has_arg(pnVar3 + arg._4_4_);
          if (iVar1 == 0) {
            nn_option_error("does not accept argument",ctx,arg._4_4_);
          }
          else {
            nn_process_option(ctx,arg._4_4_,pcVar2 + (long)best_match + 1);
          }
        }
        else {
          iVar1 = nn_has_arg(pnVar3 + arg._4_4_);
          if (iVar1 == 0) {
            nn_process_option(ctx,arg._4_4_,(char *)0x0);
          }
          else {
            iVar1 = nn_get_arg(ctx);
            if (iVar1 == 0) {
              nn_option_error("requires an argument",ctx,arg._4_4_);
            }
            else {
              nn_process_option(ctx,arg._4_4_,ctx->data);
            }
          }
        }
      }
      return;
    }
    b = pnVar3->longname;
    for (_cur_prefix = pcVar2; (*_cur_prefix != '\0' && (*_cur_prefix != '='));
        _cur_prefix = _cur_prefix + 1) {
      if (*_cur_prefix != *b) goto LAB_00105ca8;
      b = b + 1;
    }
    iVar1 = (int)b - (int)pnVar3->longname;
    if (*b == '\0') {
      arg._4_4_ = local_44;
      best_match = iVar1;
      goto LAB_00105cba;
    }
    if (iVar1 == best_match) {
      arg._4_4_ = -1;
    }
    else if (best_match < iVar1) {
      arg._4_4_ = local_44;
      best_match = iVar1;
    }
LAB_00105ca8:
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static void nn_parse_long_option (struct nn_parse_context *ctx)
{
    struct nn_option *opt;
    char *a, *b;
    int longest_prefix;
    int cur_prefix;
    int best_match;
    char *arg;
    int i;

    arg = ctx->data+2;
    longest_prefix = 0;
    best_match = -1;
    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        for (a = opt->longname, b = arg;; ++a, ++b) {
            if (*b == 0 || *b == '=') {  /* End of option on command-line */
                cur_prefix = a - opt->longname;
                if (!*a) {  /* Matches end of option name */
                    best_match = i;
                    longest_prefix = cur_prefix;
                    goto finish;
                }
                if (cur_prefix == longest_prefix) {
                    best_match = -1;  /* Ambiguity */
                } else if (cur_prefix > longest_prefix) {
                    best_match = i;
                    longest_prefix = cur_prefix;
                }
                break;
            } else if (*b != *a) {
                break;
            }
        }
    }
finish:
    if (best_match >= 0) {
        opt = &ctx->options[best_match];
        ctx->last_option_usage[best_match] = ctx->data;
        if (arg[longest_prefix] == '=') {
            if (nn_has_arg (opt)) {
                nn_process_option (ctx, best_match, arg + longest_prefix + 1);
            } else {
                nn_option_error ("does not accept argument", ctx, best_match);
            }
        } else {
            if (nn_has_arg (opt)) {
                if (nn_get_arg (ctx)) {
                    nn_process_option (ctx, best_match, ctx->data);
                } else {
                    nn_option_error ("requires an argument", ctx, best_match);
                }
            } else {
                nn_process_option (ctx, best_match, NULL);
            }
        }
    } else if (longest_prefix > 0) {
        nn_error_ambiguous_option (ctx);
    } else {
        nn_error_unknown_long_option (ctx);
    }
}